

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddGlobalTarget_EditCache
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  string *__x;
  bool bVar3;
  allocator<char> local_1c9;
  value_type local_1c8;
  allocator<char> local_1a1;
  value_type local_1a0;
  allocator<char> local_179;
  value_type local_178;
  allocator<char> local_151;
  value_type local_150;
  allocator<char> local_129;
  value_type local_128;
  undefined1 local_108 [8];
  string edit_cmd;
  cmCustomCommandLine singleLine;
  undefined1 local_c0 [8];
  GlobalTargetInfo gti;
  char *editCacheTargetName;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *targets_local;
  cmGlobalGenerator *this_local;
  
  iVar1 = (*this->_vptr_cmGlobalGenerator[0x21])();
  gti._152_8_ = CONCAT44(extraout_var,iVar1);
  if (gti._152_8_ != 0) {
    GlobalTargetInfo::GlobalTargetInfo((GlobalTargetInfo *)local_c0);
    std::__cxx11::string::operator=((string *)local_c0,(char *)gti._152_8_);
    gti.WorkingDir.field_2._12_4_ = 1;
    cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)((long)&edit_cmd.field_2 + 8));
    (*this->_vptr_cmGlobalGenerator[0x24])(local_108);
    uVar2 = std::__cxx11::string::empty();
    bVar3 = (uVar2 & 1) != 0;
    if (bVar3) {
      __x = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&edit_cmd.field_2 + 8),__x);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"-E",&local_179);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&edit_cmd.field_2 + 8),&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator(&local_179);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"echo",&local_1a1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&edit_cmd.field_2 + 8),&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"No interactive CMake dialog available.",&local_1c9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&edit_cmd.field_2 + 8),&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
      std::__cxx11::string::operator=
                ((string *)(gti.Name.field_2._M_local_buf + 8),
                 "No interactive CMake dialog available...");
      gti.UsesTerminal = true;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&edit_cmd.field_2 + 8),(value_type *)local_108);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"-S$(CMAKE_SOURCE_DIR)",&local_129);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&edit_cmd.field_2 + 8),&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"-B$(CMAKE_BINARY_DIR)",&local_151);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&edit_cmd.field_2 + 8),&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
      std::__cxx11::string::operator=
                ((string *)(gti.Name.field_2._M_local_buf + 8),"Running CMake cache editor...");
    }
    gti.WorkingDir.field_2._M_local_buf[8] = !bVar3;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
               ((long)&gti.Message.field_2 + 8),(value_type *)((long)&edit_cmd.field_2 + 8));
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::push_back(targets,(value_type *)local_c0);
    std::__cxx11::string::~string((string *)local_108);
    cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)((long)&edit_cmd.field_2 + 8));
    GlobalTargetInfo::~GlobalTargetInfo((GlobalTargetInfo *)local_c0);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_EditCache(
  std::vector<GlobalTargetInfo>& targets) const
{
  const char* editCacheTargetName = this->GetEditCacheTargetName();
  if (!editCacheTargetName) {
    return;
  }
  GlobalTargetInfo gti;
  gti.Name = editCacheTargetName;
  gti.PerConfig = cmTarget::PerConfig::No;
  cmCustomCommandLine singleLine;

  // Use generator preference for the edit_cache rule if it is defined.
  std::string edit_cmd = this->GetEditCacheCommand();
  if (!edit_cmd.empty()) {
    singleLine.push_back(std::move(edit_cmd));
    singleLine.push_back("-S$(CMAKE_SOURCE_DIR)");
    singleLine.push_back("-B$(CMAKE_BINARY_DIR)");
    gti.Message = "Running CMake cache editor...";
    gti.UsesTerminal = true;
  } else {
    singleLine.push_back(cmSystemTools::GetCMakeCommand());
    singleLine.push_back("-E");
    singleLine.push_back("echo");
    singleLine.push_back("No interactive CMake dialog available.");
    gti.Message = "No interactive CMake dialog available...";
    gti.UsesTerminal = false;
    gti.StdPipesUTF8 = true;
  }
  gti.CommandLines.push_back(std::move(singleLine));

  targets.push_back(std::move(gti));
}